

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArrayKernel.hh
# Opt level: O3

void __thiscall OpenMesh::ArrayKernel::request_edge_status(ArrayKernel *this)

{
  uint uVar1;
  string local_40;
  
  uVar1 = this->refcount_estatus_;
  this->refcount_estatus_ = uVar1 + 1;
  if (uVar1 == 0) {
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"e:status","");
    BaseKernel::add_property<OpenMesh::Attributes::StatusInfo>
              (&this->super_BaseKernel,&this->edge_status_,&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p);
    }
  }
  return;
}

Assistant:

void request_edge_status()
  {
    if (!refcount_estatus_++)
      add_property( edge_status_, "e:status" );
  }